

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Vec_Wec_t * Gia_ManFindCofs(Gia_Man_t *p,Vec_Int_t *vRes,Gia_Man_t **ppNew)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  
  iVar6 = vRes->nSize;
  uVar19 = 1 << ((byte)iVar6 & 0x1f);
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  uVar15 = 8;
  if (8 < uVar19) {
    uVar15 = uVar19;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar15;
  pVVar8 = (Vec_Int_t *)calloc((long)(int)uVar15,0x10);
  pVVar7->pArray = pVVar8;
  pVVar7->nSize = uVar19;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (p->vCis->nSize <= vRes->nSize) {
    __assert_fail("Vec_IntSize(vRes) < Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x40f,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
  }
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    do {
      iVar1 = pVVar11->pArray[lVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_002225b2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar12 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar12)) {
LAB_0022260f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar12 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar12)) goto LAB_0022260f;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar11 = p->vCis;
    } while (lVar16 < pVVar11->nSize);
  }
  if (iVar6 != 0x1f) {
    uVar13 = 1;
    if (1 < (int)uVar19) {
      uVar13 = (ulong)uVar19;
    }
    uVar18 = 0;
    do {
      iVar6 = vRes->nSize;
      if (0 < (long)iVar6) {
        piVar5 = vRes->pArray;
        pVVar11 = p->vCis;
        lVar16 = 0;
        do {
          iVar1 = piVar5[lVar16];
          if (((long)iVar1 < 0) || (pVVar11->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar1 = pVVar11->pArray[iVar1];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_002225b2;
          p->pObjs[iVar1].Value = (uint)(((uint)uVar18 >> ((uint)lVar16 & 0x1f) & 1) != 0);
          lVar16 = lVar16 + 1;
        } while (iVar6 != lVar16);
      }
      if (0 < p->nObjs) {
        lVar16 = 8;
        lVar17 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar14 = *(ulong *)((long)pGVar3 + lVar16 + -8);
          if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            uVar15 = *(uint *)((long)pGVar3 +
                              lVar16 + (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3);
            if (((int)uVar15 < 0) ||
               (uVar19 = *(uint *)((long)pGVar3 +
                                  lVar16 + (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar19 < 0)) goto LAB_002225f0;
            iVar6 = Gia_ManHashAnd(p_00,uVar15 ^ (uint)(uVar14 >> 0x1d) & 1,
                                   uVar19 ^ (uint)(uVar14 >> 0x3d) & 1);
            *(int *)(&pGVar3->field_0x0 + lVar16) = iVar6;
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0xc;
        } while (lVar17 < p->nObjs);
      }
      pVVar11 = p->vCos;
      uVar15 = pVVar11->nSize;
      uVar14 = (ulong)uVar15;
      if (0 < (int)uVar15) {
        lVar16 = 0;
        do {
          uVar15 = (uint)uVar14;
          iVar6 = pVVar11->pArray[lVar16];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_002225b2;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar6;
          uVar19 = (uint)*(undefined8 *)pGVar3;
          uVar15 = pGVar3[-(ulong)(uVar19 & 0x1fffffff)].Value;
          if ((int)uVar15 < 0) {
LAB_002225f0:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Vec_IntPush(pVVar8 + uVar18,uVar19 >> 0x1d & 1 ^ uVar15);
          lVar16 = lVar16 + 1;
          pVVar11 = p->vCos;
          uVar15 = pVVar11->nSize;
          uVar14 = (ulong)(int)uVar15;
        } while (lVar16 < (long)uVar14);
      }
      if (pVVar8[uVar18].nSize != uVar15) {
        __assert_fail("Vec_IntSize(vLayer) == Gia_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x41b,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar13);
  }
  if (ppNew != (Gia_Man_t **)0x0) {
    *ppNew = p_00;
  }
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManFindCofs( Gia_Man_t * p, Vec_Int_t * vRes, Gia_Man_t ** ppNew )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vCofs = Vec_WecStart( 1 << Vec_IntSize(vRes) );
    int Value, i, m, nMints = 1 << Vec_IntSize(vRes);
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    assert( Vec_IntSize(vRes) < Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( m = 0; m < nMints; m++ )
    {
        Vec_Int_t * vLayer = Vec_WecEntry( vCofs, m );
        Vec_IntForEachEntry( vRes, Value, i )
            Gia_ManCi(p, Value)->Value = (unsigned)((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            Vec_IntPush( vLayer, Gia_ObjFanin0Copy(pObj) );
        assert( Vec_IntSize(vLayer) == Gia_ManCoNum(p) );
        //printf( "%3d : ", m ); Vec_IntPrint( vLayer );
    }
    if ( ppNew != NULL )
        *ppNew = pNew;
    return vCofs;
}